

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getTransferMethodStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TransferMethod method,
          bool isDescription)

{
  char cVar1;
  ostringstream *this_00;
  size_type ndx;
  char cVar2;
  char *pcVar3;
  size_type ndx_1;
  long lVar4;
  ulong uVar5;
  locale loc;
  ostringstream desc;
  locale alStack_1b8 [8];
  string *local_1b0;
  ostringstream local_1a8 [376];
  
  this_00 = local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::locale::locale(alStack_1b8);
  cVar2 = (char)method;
  switch((ulong)this & 0xffffffff) {
  case 0:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 0xb; lVar4 = lVar4 + 1) {
      if (lVar4 == 4 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("COPY_BUFFER"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 1:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      if (lVar4 == 4 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("COPY_IMAGE"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 2:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      if (lVar4 == 4 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("BLIT_IMAGE"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 3:
    local_1b0 = __return_storage_ptr__;
    for (uVar5 = 0; uVar5 != 0x14; uVar5 = uVar5 + 1) {
      if ((cVar2 == '\0') || ((0x4810UL >> (uVar5 & 0x3f) & 1) == 0)) {
        cVar1 = std::tolower<char>("COPY_BUFFER_TO_IMAGE"[uVar5],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
      else {
        std::operator<<((ostream *)local_1a8," ");
      }
    }
    break;
  case 4:
    local_1b0 = __return_storage_ptr__;
    for (uVar5 = 0; uVar5 != 0x14; uVar5 = uVar5 + 1) {
      if ((cVar2 == '\0') || ((0x2410UL >> (uVar5 & 0x3f) & 1) == 0)) {
        cVar1 = std::tolower<char>("COPY_IMAGE_TO_BUFFER"[uVar5],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
      else {
        std::operator<<((ostream *)local_1a8," ");
      }
    }
    break;
  case 5:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
      if (lVar4 == 6 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("UPDATE_BUFFER"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 6:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 0xb; lVar4 = lVar4 + 1) {
      if (lVar4 == 4 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("FILL_BUFFER"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 7:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
      if ((cVar2 == '\0') || ((lVar4 != 0xb && (lVar4 != 5)))) {
        cVar1 = std::tolower<char>("CLEAR_COLOR_IMAGE"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
      else {
        std::operator<<((ostream *)local_1a8," ");
      }
    }
    break;
  case 8:
    local_1b0 = __return_storage_ptr__;
    for (uVar5 = 0; uVar5 != 0x19; uVar5 = uVar5 + 1) {
      if ((cVar2 == '\0') || ((0x80820UL >> (uVar5 & 0x3f) & 1) == 0)) {
        cVar1 = std::tolower<char>("CLEAR_DEPTH_STENCIL_IMAGE"[uVar5],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
      else {
        std::operator<<((ostream *)local_1a8," ");
      }
    }
    break;
  case 9:
    local_1b0 = __return_storage_ptr__;
    for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
      if (lVar4 == 7 && cVar2 == '\x01') {
        std::operator<<((ostream *)local_1a8," ");
      }
      else {
        cVar1 = std::tolower<char>("RESOLVE_IMAGE"[lVar4],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
    }
    break;
  case 10:
    local_1b0 = __return_storage_ptr__;
    for (uVar5 = 0; uVar5 != 0x17; uVar5 = uVar5 + 1) {
      if ((cVar2 == '\0') || ((0x8410UL >> (uVar5 & 0x3f) & 1) == 0)) {
        cVar1 = std::tolower<char>("COPY_QUERY_POOL_RESULTS"[uVar5],alStack_1b8);
        std::operator<<((ostream *)local_1a8,cVar1);
      }
      else {
        std::operator<<((ostream *)local_1a8," ");
      }
    }
    break;
  default:
    pcVar3 = "unknown method!";
    goto LAB_004deb06;
  }
  pcVar3 = "_";
  if (cVar2 != '\0') {
    pcVar3 = " ";
  }
  this_00 = (ostringstream *)std::operator<<((ostream *)local_1a8,pcVar3);
  pcVar3 = "method";
  __return_storage_ptr__ = local_1b0;
LAB_004deb06:
  std::operator<<((ostream *)this_00,pcVar3);
  std::__cxx11::stringbuf::str();
  std::locale::~locale(alStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string getTransferMethodStr(const TransferMethod method,
								 bool                 isDescription)
{
	std::ostringstream desc;
	std::locale loc;
	switch(method)
	{
#define METHOD_CASE(p)                             \
		case TRANSFER_METHOD_##p:                  \
		{                                          \
			GEN_DESC_STRING(p, method);            \
			break;                                 \
		}
	  METHOD_CASE(COPY_BUFFER)
	  METHOD_CASE(COPY_IMAGE)
	  METHOD_CASE(BLIT_IMAGE)
	  METHOD_CASE(COPY_BUFFER_TO_IMAGE)
	  METHOD_CASE(COPY_IMAGE_TO_BUFFER)
	  METHOD_CASE(UPDATE_BUFFER)
	  METHOD_CASE(FILL_BUFFER)
	  METHOD_CASE(CLEAR_COLOR_IMAGE)
	  METHOD_CASE(CLEAR_DEPTH_STENCIL_IMAGE)
	  METHOD_CASE(RESOLVE_IMAGE)
	  METHOD_CASE(COPY_QUERY_POOL_RESULTS)
#undef METHOD_CASE
	  default:
		desc << "unknown method!";
		DE_FATAL("Unknown method!");
		break;
	};

	return desc.str();
}